

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O1

void gog::probe_bin_files(extract_options *o,info *info,path *setup_file,bool external)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pdVar3;
  undefined *puVar4;
  size_t sVar5;
  long *plVar6;
  pointer pdVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  size_type *psVar11;
  size_t sVar12;
  size_t start;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  path dir;
  string local_b8;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  path local_58;
  size_t local_38;
  
  boost::filesystem::path::parent_path();
  boost::filesystem::path::stem();
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_b8._M_dataplus._M_p,
             local_b8._M_dataplus._M_p + local_b8._M_string_length);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  std::__cxx11::string::append((char *)&local_b8);
  sVar5 = anon_unknown_0::probe_bin_file_series(o,info,&local_58,&local_b8,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  std::__cxx11::string::append((char *)local_78);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_78);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_b8.field_2._M_allocated_capacity = *psVar11;
    local_b8.field_2._8_8_ = plVar6[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar11;
    local_b8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_b8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_38 = sVar5;
  sVar5 = anon_unknown_0::probe_bin_file_series(o,info,&local_58,&local_b8,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (external) {
    pdVar7 = (info->data_entries).
             super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (info->data_entries).
             super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar7 == pdVar3) {
      uVar14 = 0;
    }
    else {
      uVar10 = 0;
      do {
        uVar13 = (pdVar7->chunk).first_slice;
        uVar2 = (pdVar7->chunk).last_slice;
        if (uVar13 < uVar10) {
          uVar13 = uVar10;
        }
        uVar10 = uVar13;
        if (uVar13 <= uVar2) {
          uVar10 = uVar2;
        }
        uVar14 = (ulong)uVar10;
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 != pdVar3);
    }
    sVar12 = 0;
    if ((external) && ((info->header).slices_per_disk == 1)) {
      sVar12 = uVar14 + 1;
    }
  }
  else {
    uVar14 = 0;
    sVar12 = 0;
  }
  sVar12 = anon_unknown_0::probe_bin_file_series(o,info,&local_58,&local_98,1,sVar12);
  if ((external) && (sVar8 = (info->header).slices_per_disk, sVar8 != 1)) {
    start = uVar14 + 1;
  }
  else {
    start = 0;
    sVar8 = 2;
  }
  sVar8 = anon_unknown_0::probe_bin_file_series(o,info,&local_58,&local_98,sVar8,start);
  puVar4 = color::yellow;
  lVar16 = sVar5 + local_38 + sVar12 + sVar8;
  if (lVar16 != 0) {
    if (o->extract == false) {
      if (o->test == false) {
        pcVar15 = "inspecting";
        if (o->list != false) {
          pcVar15 = "listing the contents of";
        }
      }
      else {
        pcVar15 = "testing";
      }
    }
    else {
      pcVar15 = "extracting";
    }
    color::current = color::yellow;
    if (color::yellow == (undefined *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1784f8);
    }
    else {
      sVar9 = strlen(color::yellow);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,puVar4,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Use the --gog option to try ",0x1c);
    sVar9 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar15,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
    pcVar15 = "these files";
    if (lVar16 == 1) {
      pcVar15 = "this file";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,pcVar15,(ulong)(lVar16 != 1) * 2 + 9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".\n",2);
    puVar4 = color::reset;
    color::current = color::reset;
    if (color::reset == (undefined *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1784f8);
    }
    else {
      sVar9 = strlen(color::reset);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,puVar4,sVar9);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_pathname._M_dataplus._M_p != &local_58.m_pathname.field_2) {
    operator_delete(local_58.m_pathname._M_dataplus._M_p,
                    local_58.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void probe_bin_files(const extract_options & o, const setup::info & info,
                     const fs::path & setup_file, bool external) {
	
	boost::filesystem::path dir = setup_file.parent_path();
	std::string basename = util::as_string(setup_file.stem());
	
	size_t bin_count = 0;
	bin_count += probe_bin_file_series(o, info, dir, basename + ".bin");
	bin_count += probe_bin_file_series(o, info, dir, basename + "-0" + ".bin");
	

	boost::uint32_t max_slice = 0;
	if(external) {
		BOOST_FOREACH(const setup::data_entry & location, info.data_entries) {
			max_slice = std::max(max_slice, location.chunk.first_slice);
			max_slice = std::max(max_slice, location.chunk.last_slice);
		}
	}
	
	size_t slice =  0;
	size_t format = 1;
	if(external && info.header.slices_per_disk == 1) {
		slice = size_t(max_slice) + 1;
	}
	bin_count += probe_bin_file_series(o, info, dir, basename, format, slice);
	
	slice = 0;
	format = 2;
	if(external && info.header.slices_per_disk != 1) {
		slice = size_t(max_slice) + 1;
		format = info.header.slices_per_disk;
	}
	bin_count += probe_bin_file_series(o, info, dir, basename, format, slice);
	
	if(bin_count) {
		const char * verb = "inspecting";
		if(o.extract) {
			verb = "extracting";
		} else if(o.test) {
			verb = "testing";
		} else if(o.list) {
			verb = "listing the contents of";
		}
		std::cerr << color::yellow << "Use the --gog option to try " << verb << " "
		          << (bin_count > 1 ? "these files" : "this file") << ".\n" << color::reset;
	}
	
}